

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vcd_trace.cpp
# Opt level: O3

ssize_t __thiscall
sc_core::vcd_sc_signed_trace::write(vcd_sc_signed_trace *this,int __fd,void *__buf,size_t __n)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer pcVar3;
  int iVar4;
  sc_signed_bitref_r *this_00;
  uint64 uVar5;
  sc_signed *psVar6;
  undefined4 in_register_00000034;
  uint uVar7;
  size_type __n_00;
  pointer pcVar8;
  allocator_type local_4a;
  value_type_conflict local_49;
  vector<char,_std::allocator<char>_> local_48;
  
  if (write(_IO_FILE*)::compdata == '\0') {
    iVar4 = __cxa_guard_acquire(&write(_IO_FILE*)::compdata);
    if (iVar4 != 0) {
      write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)operator_new(0x400);
      pcVar8 = write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + 0x400;
      write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pcVar8;
      memset(write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,0,0x400);
      write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar8;
      __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&write::compdata,&__dso_handle)
      ;
      __cxa_guard_release(&write(_IO_FILE*)::compdata);
    }
  }
  if (write(_IO_FILE*)::rawdata == '\0') {
    iVar4 = __cxa_guard_acquire(&write(_IO_FILE*)::rawdata);
    if (iVar4 != 0) {
      write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)0x0;
      write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = (pointer)0x0;
      write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)operator_new(0x400);
      pcVar8 = write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + 0x400;
      write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = pcVar8;
      memset(write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,0,0x400);
      write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_finish = pcVar8;
      __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&write::rawdata,&__dso_handle);
      __cxa_guard_release(&write(_IO_FILE*)::rawdata);
    }
  }
  iVar4 = this->object->nbits;
  if ((ulong)((long)write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start) <= (ulong)(long)iVar4) {
    __n_00 = ((long)iVar4 & 0xfffffffffffff000U) + 0x1000;
    local_49 = '\0';
    std::vector<char,_std::allocator<char>_>::vector(&local_48,__n_00,&local_49,&local_4a);
    pcVar3 = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pcVar2 = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pcVar1 = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar8 = write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = pcVar1;
    write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar2;
    write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pcVar3;
    if (pcVar8 != (pointer)0x0) {
      operator_delete(pcVar8);
    }
    local_49 = '\0';
    std::vector<char,_std::allocator<char>_>::vector(&local_48,__n_00,&local_49,&local_4a);
    pcVar3 = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pcVar2 = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pcVar1 = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar8 = write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = pcVar1;
    write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar2;
    write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pcVar3;
    if (pcVar8 != (pointer)0x0) {
      operator_delete(pcVar8);
    }
    iVar4 = this->object->nbits;
  }
  pcVar8 = write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < iVar4) {
    uVar7 = iVar4 + 1;
    do {
      this_00 = sc_dt::sc_signed::operator[](this->object,uVar7 - 2);
      uVar5 = sc_dt::sc_signed_bitref_r::operator_cast_to_unsigned_long_long(this_00);
      *pcVar8 = "01"[uVar5 != 0];
      pcVar8 = pcVar8 + 1;
      uVar7 = uVar7 - 1;
    } while (1 < uVar7);
  }
  *pcVar8 = '\0';
  vcd_trace::compose_data_line
            (&this->super_vcd_trace,
             write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,
             write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  fputs(write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start,(FILE *)CONCAT44(in_register_00000034,__fd));
  psVar6 = sc_dt::sc_signed::operator=(&this->old_value,this->object);
  return (ssize_t)psVar6;
}

Assistant:

void
vcd_sc_signed_trace::write(FILE* f)
{
    static std::vector<char> compdata(1024), rawdata(1024);
    typedef std::vector<char>::size_type size_t;

    if ( compdata.size() <= static_cast<size_t>(object.length()) ) { // include trailing \0
        size_t sz = ( static_cast<size_t>(object.length()) + 4096 ) & (~static_cast<size_t>(4096-1));
        std::vector<char>( sz ).swap( compdata ); // resize without copying values
        std::vector<char>( sz ).swap( rawdata );
    }
    char *rawdata_ptr  = &rawdata[0];

    for (int bitindex = object.length() - 1; bitindex >= 0; --bitindex) {
        *rawdata_ptr++ = "01"[object[bitindex].to_bool()];
    }
    *rawdata_ptr = '\0';
    compose_data_line(&rawdata[0], &compdata[0]);

    std::fputs(&compdata[0], f);
    old_value = object;
}